

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.h
# Opt level: O3

void __thiscall
pbrt::LightSceneEntity::LightSceneEntity
          (LightSceneEntity *this,string *name,ParameterDictionary *parameters,FileLoc loc,
          AnimatedTransform *renderFromLight,string *medium)

{
  pointer pcVar1;
  polymorphic_allocator<pbrt::ParsedParameter_*> local_a0;
  ParameterDictionary local_98;
  
  local_a0.memoryResource = pstd::pmr::new_delete_resource();
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(&local_98.params,&parameters->params,&local_a0);
  local_98.colorSpace = parameters->colorSpace;
  TransformedSceneEntity::TransformedSceneEntity
            (&this->super_TransformedSceneEntity,name,&local_98,loc,renderFromLight);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&local_98.params);
  (this->medium)._M_dataplus._M_p = (pointer)&(this->medium).field_2;
  pcVar1 = (medium->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->medium,pcVar1,pcVar1 + medium->_M_string_length);
  return;
}

Assistant:

LightSceneEntity(const std::string &name, ParameterDictionary parameters, FileLoc loc,
                     const AnimatedTransform &renderFromLight, const std::string &medium)
        : TransformedSceneEntity(name, parameters, loc, renderFromLight),
          medium(medium) {}